

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O1

int ssl_parse_alpn_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t len)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  byte *pbVar4;
  ulong __n;
  char **ppcVar5;
  char *local_48;
  
  ppcVar5 = ssl->conf->alpn_list;
  iVar3 = 0;
  if (((ppcVar5 != (char **)0x0) && (iVar3 = -0x7900, 3 < len)) &&
     ((ulong)(ushort)(*(ushort *)buf << 8 | *(ushort *)buf >> 8) == len - 2)) {
    local_48 = *ppcVar5;
    if (local_48 != (char *)0x0) {
      do {
        sVar2 = strlen(local_48);
        pbVar4 = buf + 2;
        do {
          if (buf + len < pbVar4) {
            return -0x7900;
          }
          __n = (ulong)*pbVar4;
          if (__n == 0) {
            return -0x7900;
          }
          if ((sVar2 == __n) && (iVar1 = bcmp(pbVar4 + 1,local_48,__n), iVar1 == 0)) {
            ssl->alpn_chosen = local_48;
            return 0;
          }
          pbVar4 = pbVar4 + 1 + __n;
        } while (pbVar4 != buf + len);
        local_48 = ppcVar5[1];
        ppcVar5 = ppcVar5 + 1;
      } while (local_48 != (char *)0x0);
    }
    mbedtls_ssl_send_alert_message(ssl,'\x02','x');
  }
  return iVar3;
}

Assistant:

static int ssl_parse_alpn_ext( mbedtls_ssl_context *ssl,
                               const unsigned char *buf, size_t len )
{
    size_t list_len, cur_len, ours_len;
    const unsigned char *theirs, *start, *end;
    const char **ours;

    /* If ALPN not configured, just ignore the extension */
    if( ssl->conf->alpn_list == NULL )
        return( 0 );

    /*
     * opaque ProtocolName<1..2^8-1>;
     *
     * struct {
     *     ProtocolName protocol_name_list<2..2^16-1>
     * } ProtocolNameList;
     */

    /* Min length is 2 (list_len) + 1 (name_len) + 1 (name) */
    if( len < 4 )
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );

    list_len = ( buf[0] << 8 ) | buf[1];
    if( list_len != len - 2 )
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );

    /*
     * Use our order of preference
     */
    start = buf + 2;
    end = buf + len;
    for( ours = ssl->conf->alpn_list; *ours != NULL; ours++ )
    {
        ours_len = strlen( *ours );
        for( theirs = start; theirs != end; theirs += cur_len )
        {
            /* If the list is well formed, we should get equality first */
            if( theirs > end )
                return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );

            cur_len = *theirs++;

            /* Empty strings MUST NOT be included */
            if( cur_len == 0 )
                return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );

            if( cur_len == ours_len &&
                memcmp( theirs, *ours, cur_len ) == 0 )
            {
                ssl->alpn_chosen = *ours;
                return( 0 );
            }
        }
    }

    /* If we get there, no match was found */
    mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                            MBEDTLS_SSL_ALERT_MSG_NO_APPLICATION_PROTOCOL );
    return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_HELLO );
}